

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult *
iuutil::CmpHelperSTRLNEQ
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,size_t len1,string *val2)

{
  AssertionResult *pAVar1;
  AssertionResult local_60;
  string *local_38;
  size_t len2;
  string *val2_local;
  size_t len1_local;
  char *expr2_local;
  char *expr1_local;
  
  len2 = (size_t)val2;
  val2_local = (string *)len1;
  len1_local = (size_t)expr2;
  expr2_local = expr1;
  expr1_local = (char *)__return_storage_ptr__;
  local_38 = (string *)std::__cxx11::string::length();
  if (local_38 == val2_local) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar1 = iutest::AssertionResult::operator<<(&local_60,(char (*) [18])"error: Value of: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&expr2_local);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])" == strlen(");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char **)&len1_local);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [2])0x1552b0);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])"\n  Actual: ");
    pAVar1 = iutest::AssertionResult::operator<<
                       (pAVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               len2);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [4])" : ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(unsigned_long *)&local_38);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])"\nExpected: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(unsigned_long *)&val2_local);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    iutest::AssertionResult::~AssertionResult(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperSTRLNEQ(const char* expr1, const char* expr2
                                        , size_t len1, const ::std::string& val2)
{
    const size_t len2 = val2.length();
    if( len2 == len1 )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << expr1 << " == strlen(" << expr2 << ")"
        << "\n  Actual: " << val2 << " : " << len2 << "\nExpected: " << len1;
}